

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso3.c
# Opt level: O2

int Gia_Iso3Unique(Vec_Int_t *vSign)

{
  int iVar1;
  int iVar2;
  void *__dest;
  size_t sVar3;
  size_t __nmemb;
  long lVar4;
  
  iVar2 = vSign->nSize;
  __nmemb = (size_t)iVar2;
  if (__nmemb == 0) {
    sVar3 = 0;
    __dest = (void *)0x0;
  }
  else {
    sVar3 = __nmemb * 4;
    __dest = malloc(sVar3);
  }
  memcpy(__dest,vSign->pArray,sVar3);
  if (1 < iVar2) {
    qsort(__dest,__nmemb,4,Vec_IntSortCompare1);
    iVar2 = 1;
    for (sVar3 = 1; __nmemb != sVar3; sVar3 = sVar3 + 1) {
      iVar1 = *(int *)((long)__dest + sVar3 * 4);
      if (iVar1 != *(int *)((long)__dest + sVar3 * 4 + -4)) {
        lVar4 = (long)iVar2;
        iVar2 = iVar2 + 1;
        *(int *)((long)__dest + lVar4 * 4) = iVar1;
      }
    }
  }
  free(__dest);
  return iVar2;
}

Assistant:

int Gia_Iso3Unique( Vec_Int_t * vSign )
{
    int nUnique;
    Vec_Int_t * vCopy = Vec_IntDup( vSign );
    Vec_IntUniqify( vCopy );
    nUnique = Vec_IntSize(vCopy);
    Vec_IntFree( vCopy );
    return nUnique;
}